

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

int main(void)

{
  char *local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  Am_Style *local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined8 local_80;
  Am_Style *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  Am_Drawonable *local_60;
  Am_Style *local_58;
  undefined8 *local_50;
  undefined1 *local_48;
  Am_Drawonable *local_40;
  Am_Style local_38 [24];
  Am_Style local_20 [8];
  undefined8 *local_18;
  Am_Drawonable *root;
  
  root._4_4_ = 0;
  local_50 = (undefined8 *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  local_58 = local_20;
  local_18 = local_50;
  Am_Style::Am_Style(local_58,(Am_Style *)&Am_No_Style);
  local_d0 = local_58;
  local_e8 = "";
  local_80 = 0;
  local_88 = 1;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 1;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = 1;
  local_c0 = 1;
  local_c8 = 0;
  local_d8 = 0;
  local_e0 = 1;
  local_48 = (undefined1 *)&local_e8;
  d1 = (Am_Drawonable *)(**(code **)*local_50)(local_50,800,10,300,200);
  local_40 = d1;
  Am_Style::~Am_Style(local_20);
  (**(code **)(*(long *)d1 + 0xa0))();
  local_70 = local_18;
  local_78 = local_38;
  Am_Style::Am_Style(local_78,(Am_Style *)&Am_No_Style);
  local_d0 = local_78;
  local_e8 = "";
  local_80 = 0;
  local_88 = 1;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 1;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = 1;
  local_c0 = 1;
  local_c8 = 0;
  local_d8 = 0;
  local_e0 = 1;
  local_68 = (undefined1 *)&local_e8;
  d2 = (Am_Drawonable *)(**(code **)*local_70)(local_70,800,0xfa,300,200);
  local_60 = d2;
  Am_Style::~Am_Style(local_38);
  (**(code **)(*(long *)d2 + 0xa0))();
  test_single_clips();
  test_multi_clips();
  test_intersections();
  test_region_fns();
  test_drawonable_fns();
  test_clear_clipping();
  test_more_clear_clipping();
  printf("Hit RETURN to exit:");
  getchar();
  return 0;
}

Assistant:

int
main()
{
  Am_Drawonable *root = Am_Drawonable::Get_Root_Drawonable();

  d1 = root->Create(TESTCLIP_D1_LEFT, 10, 300, 200);
  d1->Flush_Output();

  d2 = root->Create(TESTCLIP_D1_LEFT, 250, 300, 200);
  d2->Flush_Output();

  test_single_clips();
  test_multi_clips();
  test_intersections();
  test_region_fns();
  test_drawonable_fns();
  test_clear_clipping();
  test_more_clear_clipping();

  ///
  ///  Exit
  ///
  printf("Hit RETURN to exit:");
  getchar();

  return 0;
}